

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_string_conversion.c
# Opt level: O0

void test_archive_string_canonicalization(void)

{
  archive *v1;
  archive *paVar1;
  archive_string_conv *sc;
  wchar_t unaff_retaddr;
  char *in_stack_00000008;
  void *in_stack_00000010;
  archive_string_conv *sconv;
  archive *a;
  wchar_t in_stack_00000028;
  void *in_stack_ffffffffffffffd8;
  void *pvVar2;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar3;
  wchar_t in_stack_ffffffffffffffe4;
  wchar_t in_stack_ffffffffffffffe8;
  wchar_t in_stack_ffffffffffffffec;
  archive *in_stack_fffffffffffffff0;
  wchar_t line;
  
  setlocale(6,"en_US.UTF-8");
  v1 = archive_read_new();
  assertion_assert((char *)in_stack_fffffffffffffff0,in_stack_ffffffffffffffec,
                   in_stack_ffffffffffffffe8,
                   (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                   in_stack_ffffffffffffffd8);
  paVar1 = (archive *)
           archive_string_conversion_to_charset
                     (in_stack_fffffffffffffff0,
                      (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      in_stack_ffffffffffffffe4);
  assertion_assert((char *)paVar1,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
                   (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                   in_stack_ffffffffffffffd8);
  failure("Charset name should be UTF-8");
  archive_string_conversion_charset_name((archive_string_conv *)paVar1);
  pvVar2 = (void *)0x0;
  uVar3 = 0;
  assertion_equal_string
            (in_stack_00000008,unaff_retaddr,(char *)v1,(char *)paVar1,
             (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
             (char *)((ulong)(uint)in_stack_ffffffffffffffe4 << 0x20),a,in_stack_00000028);
  paVar1 = (archive *)
           archive_string_conversion_to_charset
                     (paVar1,(char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      in_stack_ffffffffffffffe4);
  assertion_assert((char *)paVar1,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
                   (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar3),pvVar2);
  failure("Charset name should be UTF-8");
  archive_string_conversion_charset_name((archive_string_conv *)paVar1);
  pvVar2 = (void *)0x0;
  uVar3 = 0;
  assertion_equal_string
            (in_stack_00000008,unaff_retaddr,(char *)v1,(char *)paVar1,
             (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
             (char *)((ulong)(uint)in_stack_ffffffffffffffe4 << 0x20),a,in_stack_00000028);
  paVar1 = (archive *)
           archive_string_conversion_to_charset
                     (paVar1,(char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      in_stack_ffffffffffffffe4);
  assertion_assert((char *)paVar1,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
                   (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar3),pvVar2);
  failure("Charset name should be UTF-8");
  archive_string_conversion_charset_name((archive_string_conv *)paVar1);
  pvVar2 = (void *)0x0;
  uVar3 = 0;
  assertion_equal_string
            (in_stack_00000008,unaff_retaddr,(char *)v1,(char *)paVar1,
             (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
             (char *)((ulong)(uint)in_stack_ffffffffffffffe4 << 0x20),a,in_stack_00000028);
  paVar1 = (archive *)
           archive_string_conversion_to_charset
                     (paVar1,(char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      in_stack_ffffffffffffffe4);
  assertion_assert((char *)paVar1,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
                   (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar3),pvVar2);
  failure("Charset name should be UTF-16BE");
  archive_string_conversion_charset_name((archive_string_conv *)paVar1);
  pvVar2 = (void *)0x0;
  uVar3 = 0;
  assertion_equal_string
            (in_stack_00000008,unaff_retaddr,(char *)v1,(char *)paVar1,
             (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
             (char *)((ulong)(uint)in_stack_ffffffffffffffe4 << 0x20),a,in_stack_00000028);
  paVar1 = (archive *)
           archive_string_conversion_to_charset
                     (paVar1,(char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      in_stack_ffffffffffffffe4);
  assertion_assert((char *)paVar1,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
                   (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar3),pvVar2);
  failure("Charset name should be UTF-16BE");
  archive_string_conversion_charset_name((archive_string_conv *)paVar1);
  pvVar2 = (void *)0x0;
  uVar3 = 0;
  assertion_equal_string
            (in_stack_00000008,unaff_retaddr,(char *)v1,(char *)paVar1,
             (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
             (char *)((ulong)(uint)in_stack_ffffffffffffffe4 << 0x20),a,in_stack_00000028);
  paVar1 = (archive *)
           archive_string_conversion_to_charset
                     (paVar1,(char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      in_stack_ffffffffffffffe4);
  assertion_assert((char *)paVar1,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
                   (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar3),pvVar2);
  failure("Charset name should be UTF-16BE");
  archive_string_conversion_charset_name((archive_string_conv *)paVar1);
  pvVar2 = (void *)0x0;
  uVar3 = 0;
  assertion_equal_string
            (in_stack_00000008,unaff_retaddr,(char *)v1,(char *)paVar1,
             (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
             (char *)((ulong)(uint)in_stack_ffffffffffffffe4 << 0x20),a,in_stack_00000028);
  paVar1 = (archive *)
           archive_string_conversion_to_charset
                     (paVar1,(char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      in_stack_ffffffffffffffe4);
  assertion_assert((char *)paVar1,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
                   (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar3),pvVar2);
  failure("Charset name should be UTF-16LE");
  archive_string_conversion_charset_name((archive_string_conv *)paVar1);
  pvVar2 = (void *)0x0;
  uVar3 = 0;
  assertion_equal_string
            (in_stack_00000008,unaff_retaddr,(char *)v1,(char *)paVar1,
             (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
             (char *)((ulong)(uint)in_stack_ffffffffffffffe4 << 0x20),a,in_stack_00000028);
  paVar1 = (archive *)
           archive_string_conversion_to_charset
                     (paVar1,(char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      in_stack_ffffffffffffffe4);
  assertion_assert((char *)paVar1,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
                   (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar3),pvVar2);
  failure("Charset name should be UTF-16LE");
  archive_string_conversion_charset_name((archive_string_conv *)paVar1);
  pvVar2 = (void *)0x0;
  uVar3 = 0;
  assertion_equal_string
            (in_stack_00000008,unaff_retaddr,(char *)v1,(char *)paVar1,
             (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
             (char *)((ulong)(uint)in_stack_ffffffffffffffe4 << 0x20),a,in_stack_00000028);
  sc = archive_string_conversion_to_charset
                 (paVar1,(char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                  in_stack_ffffffffffffffe4);
  assertion_assert((char *)sc,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
                   (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar3),pvVar2);
  failure("Charset name should be UTF-16LE");
  archive_string_conversion_charset_name(sc);
  uVar3 = 0;
  assertion_equal_string
            (in_stack_00000008,unaff_retaddr,(char *)v1,(char *)sc,
             (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
             (char *)((ulong)(uint)in_stack_ffffffffffffffe4 << 0x20),a,in_stack_00000028);
  line = (wchar_t)((ulong)sc >> 0x20);
  archive_read_free((archive *)0x13c4f7);
  assertion_equal_int((char *)v1,line,CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar3),0,(char *)0x13c525,
                      in_stack_00000010);
  return;
}

Assistant:

static void
test_archive_string_canonicalization(void)
{
	struct archive *a;
	struct archive_string_conv *sconv;

	setlocale(LC_ALL, "en_US.UTF-8");

	assert((a = archive_read_new()) != NULL);

	assertA(NULL != (sconv =
	    archive_string_conversion_to_charset(a, "UTF-8", 1)));
	failure("Charset name should be UTF-8");
	assertEqualString("UTF-8",
	    archive_string_conversion_charset_name(sconv));

	assertA(NULL != (sconv =
	    archive_string_conversion_to_charset(a, "UTF8", 1)));
	failure("Charset name should be UTF-8");
	assertEqualString("UTF-8",
	    archive_string_conversion_charset_name(sconv));

	assertA(NULL != (sconv =
	    archive_string_conversion_to_charset(a, "utf8", 1)));
	failure("Charset name should be UTF-8");
	assertEqualString("UTF-8",
	    archive_string_conversion_charset_name(sconv));

	assertA(NULL != (sconv =
	    archive_string_conversion_to_charset(a, "UTF-16BE", 1)));
	failure("Charset name should be UTF-16BE");
	assertEqualString("UTF-16BE",
	    archive_string_conversion_charset_name(sconv));

	assertA(NULL != (sconv =
	    archive_string_conversion_to_charset(a, "UTF16BE", 1)));
	failure("Charset name should be UTF-16BE");
	assertEqualString("UTF-16BE",
	    archive_string_conversion_charset_name(sconv));

	assertA(NULL != (sconv =
	    archive_string_conversion_to_charset(a, "utf16be", 1)));
	failure("Charset name should be UTF-16BE");
	assertEqualString("UTF-16BE",
	    archive_string_conversion_charset_name(sconv));

	assertA(NULL != (sconv =
	    archive_string_conversion_to_charset(a, "UTF-16LE", 1)));
	failure("Charset name should be UTF-16LE");
	assertEqualString("UTF-16LE",
	    archive_string_conversion_charset_name(sconv));

	assertA(NULL != (sconv =
	    archive_string_conversion_to_charset(a, "UTF16LE", 1)));
	failure("Charset name should be UTF-16LE");
	assertEqualString("UTF-16LE",
	    archive_string_conversion_charset_name(sconv));

	assertA(NULL != (sconv =
	    archive_string_conversion_to_charset(a, "utf16le", 1)));
	failure("Charset name should be UTF-16LE");
	assertEqualString("UTF-16LE",
	    archive_string_conversion_charset_name(sconv));

	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

}